

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O3

void __thiscall
CompositedBupOutputter::newMouth
          (CompositedBupOutputter *this,Image *img,Point pos,int num,
          vector<MaskRect,_std::allocator<MaskRect>_> *mask)

{
  long *plVar1;
  pointer pcVar2;
  Image *this_00;
  uint uVar3;
  undefined8 *puVar4;
  uint uVar5;
  ulong uVar6;
  uint __len;
  uint __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_1;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  long *local_78;
  undefined8 local_70;
  long local_68;
  undefined8 uStack_60;
  Image *local_58;
  vector<MaskRect,_std::allocator<MaskRect>_> *local_50;
  vector<MaskRect,_std::allocator<MaskRect>_> local_48;
  
  (this->withMouth).size = (this->withFace).size;
  local_50 = mask;
  std::vector<Color,_std::allocator<Color>_>::operator=
            (&(this->withMouth).colorData,&(this->withFace).colorData);
  local_b8 = local_a8;
  pcVar2 = (this->withFaceName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,pcVar2 + (this->withFaceName)._M_string_length);
  std::__cxx11::string::append((char *)&local_b8);
  __val = -num;
  if (0 < num) {
    __val = num;
  }
  __len = 1;
  if (9 < __val) {
    uVar6 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar5 = (uint)uVar6;
      if (uVar5 < 100) {
        __len = __len - 2;
        goto LAB_0010ebe6;
      }
      if (uVar5 < 1000) {
        __len = __len - 1;
        goto LAB_0010ebe6;
      }
      if (uVar5 < 10000) goto LAB_0010ebe6;
      uVar6 = uVar6 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar5);
    __len = __len + 1;
  }
LAB_0010ebe6:
  local_98 = local_88;
  local_58 = img;
  std::__cxx11::string::_M_construct((ulong)&local_98,(char)__len - (char)(num >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)num >> 0x1f) + (long)local_98),__len,__val);
  uVar6 = 0xf;
  if (local_b8 != local_a8) {
    uVar6 = local_a8[0];
  }
  if (uVar6 < (ulong)(local_90 + local_b0)) {
    uVar6 = 0xf;
    if (local_98 != local_88) {
      uVar6 = local_88[0];
    }
    if ((ulong)(local_90 + local_b0) <= uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
      goto LAB_0010ec7b;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98);
LAB_0010ec7b:
  local_78 = &local_68;
  plVar1 = puVar4 + 2;
  if ((long *)*puVar4 == plVar1) {
    local_68 = *plVar1;
    uStack_60 = puVar4[3];
  }
  else {
    local_68 = *plVar1;
    local_78 = (long *)*puVar4;
  }
  local_70 = puVar4[1];
  *puVar4 = plVar1;
  puVar4[1] = 0;
  *(undefined1 *)plVar1 = 0;
  std::__cxx11::string::operator=((string *)&this->withMouthName,(string *)&local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  this_00 = local_58;
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  std::vector<MaskRect,_std::allocator<MaskRect>_>::vector(&local_48,local_50);
  Image::drawOnto(this_00,&this->withMouth,pos,&local_48);
  if (local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void newMouth(const Image& img, Point pos, int num, const std::vector<MaskRect>& mask) override {
		withMouth = withFace;
		withMouthName = withFaceName + "_" + std::to_string(num);
		img.drawOnto(withMouth, pos, mask);
	}